

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall spvtools::opt::IRContext::InitializeCombinators(IRContext *this)

{
  pointer pBVar1;
  pointer pBVar2;
  Module *pMVar3;
  Instruction *extension_00;
  Capability capability;
  FeatureManager *pFVar4;
  Instruction *extension;
  Instruction **ppIVar5;
  iterator __begin2;
  iterator local_40;
  
  pFVar4 = get_feature_mgr(this);
  EnumSet<spv::Capability>::cbegin(&local_40,&pFVar4->capabilities_);
  pBVar1 = (pFVar4->capabilities_).buckets_.
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (pFVar4->capabilities_).buckets_.
           super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (((local_40.set_ != &pFVar4->capabilities_ || (local_40.bucketOffset_ != 0)) ||
         (local_40.bucketIndex_ != (long)pBVar1 - (long)pBVar2 >> 4))) {
    capability = EnumSet<spv::Capability>::Iterator::operator*(&local_40);
    AddCombinatorsForCapability(this,capability);
    EnumSet<spv::Capability>::Iterator::operator++(&local_40);
  }
  pMVar3 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar5 = (Instruction **)
            ((long)&(pMVar3->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
            0x10);
  while (extension_00 = *ppIVar5,
        extension_00 !=
        (Instruction *)
        ((long)&(pMVar3->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    AddCombinatorsForExtension(this,extension_00);
    ppIVar5 = &(extension_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisCombinators;
  return;
}

Assistant:

void IRContext::InitializeCombinators() {
  for (auto capability : get_feature_mgr()->GetCapabilities()) {
    AddCombinatorsForCapability(uint32_t(capability));
  }

  for (auto& extension : module()->ext_inst_imports()) {
    AddCombinatorsForExtension(&extension);
  }

  valid_analyses_ |= kAnalysisCombinators;
}